

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

void __thiscall
Diffusion::diffuse_tensor_Vsync
          (Diffusion *this,MultiFab *Vsync,Real dt,Real be_cn_theta,MultiFab *rho_half,int rho_flag,
          MultiFab **param_6,int param_7,bool update_fluxreg)

{
  NavierStokesBase *pNVar1;
  Diffusion *pDVar2;
  double dVar3;
  ostream *poVar4;
  long lVar5;
  EBFArrayBoxFactory *pEVar6;
  MultiFab **beta;
  long lVar7;
  double *pdVar8;
  int dir;
  int rho_comp;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  MLMG *this_00;
  int i;
  long lVar12;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *this_01;
  int k;
  long lVar13;
  _Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *this_02;
  bool bVar14;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_02;
  initializer_list<std::array<amrex::LinOpBCType,_3UL>_> __l_03;
  initializer_list<std::array<amrex::LinOpBCType,_3UL>_> __l_04;
  initializer_list<amrex::MultiFab_*> __l_05;
  initializer_list<const_amrex::MultiFab_*> __l_06;
  allocator_type local_bd1;
  Diffusion *local_bd0;
  Real local_bc8;
  int local_bc0;
  allocator_type local_bbb;
  allocator_type local_bba;
  allocator_type local_bb9;
  Real local_bb8;
  Real local_bb0;
  FluxBoxes fb_bcoef;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_b90;
  Array<LinOpBCType,_3> mlmg_lobc [3];
  long local_b58;
  long local_b48;
  EBFArrayBoxFactory *local_b40;
  Real rhsscale;
  __shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> local_b30;
  _Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  local_b20;
  Array<LinOpBCType,_3> mlmg_hibc [3];
  LPInfo local_a98;
  pair<double,_double> scalars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a68 [16];
  MLMG mlmg;
  MultiFab Soln;
  MLEBTensorOp tensorop;
  MultiFab Rhs;
  
  local_bc0 = rho_flag;
  local_bb8 = dt;
  local_bb0 = be_cn_theta;
  if (verbose != 0) {
    poVar4 = amrex::OutStream();
    amrex::Print::Print((Print *)&tensorop,poVar4);
    std::operator<<((ostream *)
                    &tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                     info.con_grid_size,"Diffusion::diffuse_tensor_Vsync ...\n");
    amrex::Print::~Print((Print *)&tensorop);
  }
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp =
       (_func_int **)0x1;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  do_agglomeration = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  do_consolidation = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  do_semicoarsening = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._3_1_ = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.agg_grid_size
       = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size
       = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  has_metric_term = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._13_3_ = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  max_coarsening_level = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  max_semicoarsening_level = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  semicoarsening_direction = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  hidden_direction = 0;
  amrex::MultiFab::MultiFab
            (&Rhs,this->grids,this->dmap,3,0,(MFInfo *)&tensorop,
             (this->navier_stokes->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
                con_grid_size);
  amrex::MultiFab::Copy(&Rhs,Vsync,0,0,3,0);
  if (1 < verbose) {
    local_bc8 = amrex::MultiFab::norm0(&Rhs,0,0,false,false);
    poVar4 = amrex::OutStream();
    amrex::Print::Print((Print *)&tensorop,poVar4);
    poVar4 = (ostream *)
             &tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
              con_grid_size;
    std::operator<<(poVar4,"Original max of Vsync ");
    std::ostream::_M_insert<double>(local_bc8);
    std::operator<<(poVar4,'\n');
    amrex::Print::~Print((Print *)&tensorop);
  }
  amrex::MFIter::MFIter((MFIter *)&tensorop,(FabArrayBase *)&Rhs,true);
  local_bd0 = this;
  while (pDVar2 = local_bd0,
        tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
        semicoarsening_direction <
        tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.verbose) {
    amrex::MFIter::tilebox((Box *)mlmg_lobc,(MFIter *)&tensorop);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&mlmg,&Rhs.super_FabArray<amrex::FArrayBox>,(MFIter *)&tensorop);
    if (local_bc0 == 1) {
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&scalars,&rho_half->super_FabArray<amrex::FArrayBox>,
                 (MFIter *)&tensorop);
      local_b48 = CONCAT44(scalars.second._4_4_,scalars.second._0_4_);
      local_b58 = CONCAT44(local_a68[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           local_a68[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_);
    }
    else {
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&Soln,
                 (FabArray<amrex::FArrayBox> *)
                 (((pDVar2->navier_stokes->super_AmrLevel).state.
                   super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                   super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                   super__Vector_impl_data._M_start)->old_data)._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                 (MFIter *)&tensorop,3);
      scalars.first =
           (double)Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase;
      local_b48 = Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_;
      scalars.second._0_4_ =
           Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type;
      scalars.second._4_4_ =
           Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._0_4_;
      local_b58 = Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_
      ;
      local_a68[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           (undefined4)
           Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_;
      local_a68[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ =
           (undefined4)
           ((ulong)Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                   _4_8_ >> 0x20);
      local_a68[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                    _12_8_;
      local_a68[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
           m_loshft.vect[2];
      local_a68[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                    _20_8_;
      local_a68[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
           Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
           m_hishft.vect[2];
      local_a68[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._4_8_ =
           Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._32_8_;
    }
    lVar13 = (long)(int)mlmg_lobc[0]._M_elems[2];
    local_bc8 = (Real)(CONCAT44(mlmg.nu1,mlmg.do_fixed_number_of_iters) * 8);
    pdVar10 = (double *)
              ((lVar13 - mlmg.bottom_verbose) * CONCAT44(mlmg.nuf,mlmg.nu2) * 8 +
               ((long)(int)mlmg_lobc[0]._M_elems[1] - (long)(int)mlmg.cf_strategy) * (long)local_bc8
               + (long)(int)mlmg_lobc[0]._M_elems[0] * 8 + (long)(int)mlmg.bottom_solver * -8 +
              mlmg._0_8_);
    for (; lVar13 <= (int)mlmg_lobc[1]._M_elems[2]; lVar13 = lVar13 + 1) {
      pdVar11 = pdVar10;
      for (lVar5 = (long)(int)mlmg_lobc[0]._M_elems[1]; lVar5 <= (int)mlmg_lobc[1]._M_elems[1];
          lVar5 = lVar5 + 1) {
        if ((int)mlmg_lobc[0]._M_elems[0] <= (int)mlmg_lobc[1]._M_elems[0]) {
          lVar7 = (long)(int)mlmg_lobc[0]._M_elems[0];
          pdVar9 = pdVar11;
          do {
            pdVar8 = pdVar9;
            lVar12 = 3;
            while (bVar14 = lVar12 != 0, lVar12 = lVar12 + -1, bVar14) {
              *pdVar8 = *(double *)
                         ((long)scalars.first +
                          (lVar13 - (int)local_a68[1].
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_) *
                          local_b58 * 8 +
                          (lVar5 - (int)local_a68[0].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                          local_b48 * 8 +
                         (lVar7 - (int)local_a68[0].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) * 8
                         ) * *pdVar8;
              pdVar8 = pdVar8 + mlmg._24_8_;
            }
            lVar7 = lVar7 + 1;
            pdVar9 = pdVar9 + 1;
          } while (mlmg_lobc[1]._M_elems[0] + 1 != (int)lVar7);
        }
        pdVar11 = pdVar11 + CONCAT44(mlmg.nu1,mlmg.do_fixed_number_of_iters);
      }
      pdVar10 = pdVar10 + CONCAT44(mlmg.nuf,mlmg.nu2);
    }
    amrex::MFIter::operator++((MFIter *)&tensorop);
  }
  amrex::MFIter::~MFIter((MFIter *)&tensorop);
  rhsscale = 1.0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp =
       (_func_int **)0x1;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  do_agglomeration = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  do_consolidation = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  do_semicoarsening = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._3_1_ = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.agg_grid_size
       = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size
       = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  has_metric_term = false;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._13_3_ = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  max_coarsening_level = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  max_semicoarsening_level = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  semicoarsening_direction = 0;
  tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
  hidden_direction = 0;
  amrex::MultiFab::MultiFab
            (&Soln,pDVar2->grids,pDVar2->dmap,3,1,(MFInfo *)&tensorop,
             (pDVar2->navier_stokes->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.
                con_grid_size);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&Soln.super_FabArray<amrex::FArrayBox>,0.0);
  local_a98.do_semicoarsening = false;
  local_a98.agg_grid_size = -1;
  local_a98.con_grid_size = -1;
  local_a98.has_metric_term = true;
  local_a98.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
  local_a98.max_coarsening_level = 0x1e;
  local_a98.max_semicoarsening_level = 0;
  local_a98.semicoarsening_direction = -1;
  local_a98.hidden_direction = -1;
  local_a98.do_consolidation = (anonymous_namespace)::consolidation != 0;
  local_bc8 = visc_tol;
  pNVar1 = local_bd0->navier_stokes;
  pEVar6 = (EBFArrayBoxFactory *)
           __dynamic_cast((pNVar1->super_AmrLevel).m_factory._M_t.
                          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                          _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                          &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (pEVar6 != (EBFArrayBoxFactory *)0x0) {
    memcpy(&mlmg,&(pNVar1->super_AmrLevel).geom,200);
    __l._M_len = 1;
    __l._M_array = (iterator)&mlmg;
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)mlmg_lobc,__l,&local_bd1
              );
    amrex::BoxArray::BoxArray((BoxArray *)&scalars,local_bd0->grids);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&scalars;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)mlmg_hibc,__l_00,
               &local_bb9);
    std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b30,
               (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
               local_bd0->dmap);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_b30;
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &fb_bcoef,__l_01,&local_bba);
    __l_02._M_len = 1;
    __l_02._M_array = &local_b40;
    local_b40 = pEVar6;
    std::
    vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)&local_b20,__l_02,&local_bbb);
    amrex::MLEBTensorOp::MLEBTensorOp
              (&tensorop,(Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)mlmg_lobc,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)mlmg_hibc,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &fb_bcoef,&local_a98,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)&local_b20);
    local_bb0 = local_bb0 * local_bb8;
    std::
    _Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
    ::~_Vector_base((_Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                     *)&local_b20);
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &fb_bcoef);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b30._M_refcount);
    this_01 = (vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)mlmg_hibc;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(this_01);
    amrex::BoxArray::~BoxArray((BoxArray *)&scalars);
    this_02 = (_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)mlmg_lobc;
    std::_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~_Vector_base(this_02);
    tensorop.super_MLEBABecLap.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.maxorder =
         tensor_max_order;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      setDomainBC(local_bd0,(array<amrex::LinOpBCType,_3UL> *)this_02,
                  (array<amrex::LinOpBCType,_3UL> *)this_01,(int)lVar13);
      this_01 = (vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                ((long)&(this_01->
                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                        _M_impl.super__Vector_impl_data._M_finish + 4);
      this_02 = (_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                ((long)&(this_02->_M_impl).super__Vector_impl_data._M_finish + 4);
    }
    mlmg.do_fixed_number_of_iters = mlmg_lobc[0]._M_elems[2];
    mlmg._0_8_ = (ulong)mlmg_lobc[0]._M_elems[1] << 0x20;
    mlmg.nuf = mlmg_lobc[1]._M_elems[2];
    mlmg.nub = mlmg_lobc[2]._M_elems[0];
    mlmg.max_fmg_iters = mlmg_lobc[2]._M_elems[1];
    mlmg.bottom_solver = mlmg_lobc[2]._M_elems[2];
    __l_03._M_len = 3;
    __l_03._M_array = (iterator)&mlmg;
    std::
    vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::vector((vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)&fb_bcoef,__l_03,(allocator_type *)&local_b30);
    scalars.second._0_4_ = mlmg_hibc[0]._M_elems[2];
    scalars.first = (double)mlmg_hibc[0]._M_elems._0_8_;
    scalars.second._4_4_ = (LinOpBCType)mlmg_hibc[1]._M_elems._0_8_;
    local_a68[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(mlmg_hibc[1]._M_elems._0_8_,4);
    local_a68[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = mlmg_hibc[1]._M_elems[2];
    local_a68[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)mlmg_hibc[2]._M_elems._0_8_;
    local_a68[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_a68[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           mlmg_hibc[2]._M_elems[2]);
    __l_04._M_len = 3;
    __l_04._M_array = (iterator)&scalars;
    std::
    vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::vector((vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)&local_b20,__l_04,(allocator_type *)&local_b40);
    amrex::MLLinOp::setDomainBC
              ((MLLinOp *)&tensorop,
               (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)&fb_bcoef,
               (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)&local_b20);
    std::
    _Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::~_Vector_base(&local_b20);
    std::
    _Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::~_Vector_base((_Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                     *)&fb_bcoef);
    if (0 < local_bd0->level) {
      amrex::MLLinOp::setCoarseFineBC
                ((MLLinOp *)&tensorop,(MultiFab *)0x0,(local_bd0->crse_ratio).vect[0]);
    }
    amrex::MLCellLinOp::setLevelBC
              ((MLCellLinOp *)&tensorop,0,(MultiFab *)0x0,(MultiFab *)0x0,(MultiFab *)0x0,
               (MultiFab *)0x0);
    amrex::MultiFab::MultiFab((MultiFab *)&mlmg);
    scalars.first = 0.0;
    scalars.second._0_4_ = 0;
    scalars.second._4_4_ = 0;
    rho_comp = 0;
    local_b90._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
         (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)rho_half;
    if (local_bc0 != 1) {
      local_b90._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (((local_bd0->navier_stokes->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start)->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
      rho_comp = 3;
    }
    computeAlpha((MultiFab *)&mlmg,&scalars,1.0,local_bb0,&rhsscale,(MultiFab *)0x0,0,local_bc0,
                 (MultiFab *)
                 local_b90._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,rho_comp);
    amrex::MLEBABecLap::setScalars
              (&tensorop.super_MLEBABecLap,scalars.first,
               (Real)CONCAT44(scalars.second._4_4_,scalars.second._0_4_));
    amrex::MLEBABecLap::setACoeffs(&tensorop.super_MLEBABecLap,0,(MultiFab *)&mlmg);
    amrex::MultiFab::~MultiFab((MultiFab *)&mlmg);
    pDVar2 = local_bd0;
    fb_bcoef.data = (MultiFab **)0x0;
    beta = FluxBoxes::define(&fb_bcoef,&local_bd0->navier_stokes->super_AmrLevel,1,0);
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&beta[lVar13]->super_FabArray<amrex::FArrayBox>,1.0);
    }
    scalars.first = 4.94065645841247e-324;
    scalars.second._0_4_ = 0;
    scalars.second._4_4_ = 0;
    local_a68[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    local_a68[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    local_a68[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a68[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)&mlmg,pDVar2->grids,pDVar2->dmap,1,0,(MFInfo *)&scalars,
               (pDVar2->navier_stokes->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_a68);
    this_00 = &mlmg;
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)this_00,1.0);
    setViscosity((Diffusion *)this_00,&tensorop,beta,0,(MultiFab *)&mlmg);
    amrex::MultiFab::~MultiFab((MultiFab *)&mlmg);
    FluxBoxes::~FluxBoxes(&fb_bcoef);
    amrex::MLMG::MLMG(&mlmg,(MLLinOp *)&tensorop);
    mlmg.max_fmg_iters = (anonymous_namespace)::max_fmg_iter;
    mlmg.verbose = verbose;
    amrex::MultiFab::mult(&Rhs,rhsscale,0,1,0);
    mlmg.final_fill_bc = 1;
    __l_05._M_len = 1;
    __l_05._M_array = (iterator)&local_b20;
    local_b20._M_impl.super__Vector_impl_data._M_start =
         (pointer)&Soln.super_FabArray<amrex::FArrayBox>;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&scalars,__l_05,
               (allocator_type *)&local_b40);
    __l_06._M_len = 1;
    __l_06._M_array = (iterator)&local_b30;
    local_b30._M_ptr = (element_type *)&Rhs;
    std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               &fb_bcoef,__l_06,(allocator_type *)&local_bd1);
    amrex::MLMG::solve(&mlmg,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                             &scalars,
                       (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                       &fb_bcoef,local_bc8,-1.0,(char *)0x0);
    std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
    ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *
                  )&fb_bcoef);
    std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
              ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&scalars);
    amrex::MultiFab::Copy(Vsync,&Soln,0,0,3,1);
    if (1 < verbose) {
      local_bc8 = amrex::MultiFab::norm0
                            (&Soln,0,Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow
                                     .vect[0],false,false);
      poVar4 = amrex::OutStream();
      amrex::Print::Print((Print *)&scalars,poVar4);
      std::operator<<((ostream *)local_a68,"Final max of Vsync ");
      std::ostream::_M_insert<double>(local_bc8);
      std::operator<<((ostream *)local_a68,'\n');
      amrex::Print::~Print((Print *)&scalars);
    }
    if (0 < pDVar2->level) {
      FluxBoxes::FluxBoxes((FluxBoxes *)&scalars,&pDVar2->navier_stokes->super_AmrLevel,3,0);
      dVar3 = scalars.first;
      computeExtensiveFluxes
                (&mlmg,&Soln,(MultiFab **)scalars.first,0,3,
                 (MultiFab *)&pDVar2->navier_stokes->field_0x540,local_bb0 / local_bb8);
      if (update_fluxreg) {
        local_bb8 = local_bb8 * local_bb8;
        for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
          amrex::FluxRegister::FineAdd
                    (pDVar2->viscflux_reg,*(MultiFab **)((long)dVar3 + lVar13 * 8),(int)lVar13,0,0,3
                     ,local_bb8);
        }
      }
      FluxBoxes::~FluxBoxes((FluxBoxes *)&scalars);
    }
    amrex::MLMG::~MLMG(&mlmg);
    amrex::MLEBTensorOp::~MLEBTensorOp(&tensorop);
    amrex::MultiFab::~MultiFab(&Soln);
    amrex::MultiFab::~MultiFab(&Rhs);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
Diffusion::diffuse_tensor_Vsync (MultiFab&              Vsync,
                                 Real                   dt,
                                 Real                   be_cn_theta,
                                 const MultiFab&        rho_half,
                                 int                    rho_flag,
                                 const MultiFab* const* /*beta*/,
                                 int                    /*betaComp*/,
                                 bool                   update_fluxreg)
{
    BL_ASSERT(rho_flag == 1 || rho_flag == 3);

    if (verbose) amrex::Print() << "Diffusion::diffuse_tensor_Vsync ...\n";

    MultiFab Rhs(grids,dmap,AMREX_SPACEDIM,0,MFInfo(),navier_stokes->Factory());

    MultiFab::Copy(Rhs,Vsync,0,0,AMREX_SPACEDIM,0);

    if (verbose > 1)
    {
        Real r_norm = Rhs.norm0();
        amrex::Print() << "Original max of Vsync " << r_norm << '\n';
    }

    //
    // Multiply RHS by density.
    //
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Rhs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const Box& bx = mfi.tilebox();
       auto const& rhs = Rhs.array(mfi);
       auto const& rho = (rho_flag == 1) ? rho_half.array(mfi) : navier_stokes->get_old_data(State_Type).array(mfi,Density);

       amrex::ParallelFor(bx, [rhs, rho]
       AMREX_GPU_DEVICE (int i, int j, int k) noexcept
       {
          for (int n = 0; n < AMREX_SPACEDIM; n++) {
             rhs(i,j,k,n) *= rho(i,j,k);
          }
       });
    }

    //
    // SET UP COEFFICIENTS FOR VISCOUS SOLVER.
    //
    const Real      a         = 1.0;
    const Real      b         = be_cn_theta*dt;
    Real rhsscale = 1.0;

    int soln_ng = 1;
    MultiFab Soln(grids,dmap,AMREX_SPACEDIM,soln_ng, MFInfo(),navier_stokes->Factory());
    Soln.setVal(0.0);

    // MLMG
    const Real tol_rel = visc_tol;
    const Real tol_abs = -1;

    LPInfo info;
    info.setAgglomeration(agglomeration);
    info.setConsolidation(consolidation);
    //info.setMaxCoarseningLevel(100);

#ifdef AMREX_USE_EB
    const auto& ebf = &dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
    MLEBTensorOp tensorop({navier_stokes->Geom()}, {grids}, {dmap}, info, {ebf});
#else
    MLTensorOp tensorop({navier_stokes->Geom()}, {grids}, {dmap}, info);
#endif

    tensorop.setMaxOrder(tensor_max_order);

    // create right container
    Array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc[AMREX_SPACEDIM];
    Array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc[AMREX_SPACEDIM];
    // fill it
    for (int i=0; i<AMREX_SPACEDIM; i++)
      setDomainBC(mlmg_lobc[i], mlmg_hibc[i], Xvel+i);
    // pass to op
    tensorop.setDomainBC({AMREX_D_DECL(mlmg_lobc[0],mlmg_lobc[1],mlmg_lobc[2])},
                         {AMREX_D_DECL(mlmg_hibc[0],mlmg_hibc[1],mlmg_hibc[2])});

    // set up level BCs
    if (level > 0) {
      tensorop.setCoarseFineBC(nullptr, crse_ratio[0]);
    }
    tensorop.setLevelBC(0, nullptr);

    {
      MultiFab acoef;
      std::pair<Real,Real> scalars;
      const MultiFab& rho = (rho_flag == 1) ? rho_half : navier_stokes->get_new_data(State_Type);
      const int rho_comp = (rho_flag == 1) ? 0 : Density;
      computeAlpha(acoef, scalars, a, b,
                   &rhsscale, nullptr, 0,
                   rho_flag, &rho, rho_comp);
      tensorop.setScalars(scalars.first, scalars.second);
      tensorop.setACoeffs(0, acoef);
    }

    {
      FluxBoxes  fb_bcoef;
      MultiFab** face_bcoef = 0;
      face_bcoef = fb_bcoef.define(navier_stokes);
      for (int dir=0; dir<AMREX_SPACEDIM; dir++) {
         face_bcoef[dir]->setVal(1.0);
      }

#ifdef AMREX_USE_EB
      MultiFab bcoefCC(grids,dmap,1,0,MFInfo(),navier_stokes->Factory());
      bcoefCC.setVal(1.0);
      setViscosity(tensorop, face_bcoef, 0, bcoefCC);
#else
      setViscosity(tensorop, face_bcoef, 0);
#endif
    }

    MLMG mlmg(tensorop);
    //fixme?
    //mlmg.setMaxIter(max_iter);
    //mlmg.setBottomVerbose(bottom_verbose);
    if (use_hypre) {
       mlmg.setBottomSolver(MLMG::BottomSolver::hypre);
       mlmg.setBottomVerbose(hypre_verbose);
    }
    mlmg.setMaxFmgIter(max_fmg_iter);
    mlmg.setVerbose(verbose);

    Rhs.mult(rhsscale,0,1);

    mlmg.setFinalFillBC(true);
    mlmg.solve({&Soln}, {&Rhs}, tol_rel, tol_abs);

    //
    // Copy into state variable at new time.
    //
    MultiFab::Copy(Vsync,Soln,0,0,AMREX_SPACEDIM,soln_ng);

    if (verbose > 1)
    {
        Real s_norm = Soln.norm0(0,Soln.nGrow());
        amrex::Print() << "Final max of Vsync " << s_norm << '\n';
    }

    if (level > 0)
    {
        FluxBoxes fb(navier_stokes, AMREX_SPACEDIM);
        MultiFab** tensorflux = fb.get();
        //
        // The extra factor of dt comes from the fact that Vsync looks
        // like dV/dt, not just an increment to V.
        //
        computeExtensiveFluxes(mlmg, Soln, tensorflux, 0, AMREX_SPACEDIM,
			       navier_stokes->area, b/dt);

        if (update_fluxreg)
        {
           for (int k = 0; k < AMREX_SPACEDIM; k++) {
              viscflux_reg->FineAdd(*(tensorflux[k]),k,Xvel,Xvel,AMREX_SPACEDIM,dt*dt);
           }
        }
    }
}